

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O3

void __thiscall
upb::generator::Output::operator()
          (Output *this,string_view format,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg,uint *arg_1,
          uint *arg_2,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg_3)

{
  pointer pcVar1;
  size_type sVar2;
  string_view data;
  char *local_108;
  size_t local_100;
  char local_f8;
  undefined7 uStack_f7;
  Output *local_e8;
  char *local_e0;
  long local_d8;
  char *local_d0;
  char local_c8 [32];
  undefined8 local_a8;
  undefined8 uStack_a0;
  char local_98 [32];
  size_type local_78;
  pointer local_70;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  long local_58;
  char *local_50;
  size_type local_48;
  pointer local_40;
  
  local_e0 = format._M_str;
  pcVar1 = (arg->_M_dataplus)._M_p;
  sVar2 = arg->_M_string_length;
  local_e8 = this;
  local_a8 = absl::lts_20240722::numbers_internal::FastIntToBuffer(*arg_1,local_98);
  local_a8 = local_a8 - (long)local_98;
  uStack_a0 = local_98;
  local_d8 = absl::lts_20240722::numbers_internal::FastIntToBuffer(*arg_2,local_c8);
  local_d8 = local_d8 - (long)local_c8;
  local_40 = (arg_3->_M_dataplus)._M_p;
  local_48 = arg_3->_M_string_length;
  local_100 = 0;
  local_f8 = '\0';
  local_68 = (undefined4)local_a8;
  uStack_64 = local_a8._4_4_;
  uStack_60 = (undefined4)uStack_a0;
  uStack_5c = uStack_a0._4_4_;
  local_108 = &local_f8;
  local_d0 = local_c8;
  local_78 = sVar2;
  local_70 = pcVar1;
  local_58 = local_d8;
  local_50 = local_c8;
  absl::lts_20240722::substitute_internal::SubstituteAndAppendArray
            (&local_108,format._M_len,local_e0,&local_78,4);
  data._M_str = local_108;
  data._M_len = local_100;
  Write(local_e8,data);
  if (local_108 != &local_f8) {
    operator_delete(local_108,CONCAT71(uStack_f7,local_f8) + 1);
  }
  return;
}

Assistant:

void operator()(absl::string_view format, const Arg&... arg) {
    Write(absl::Substitute(format, arg...));
  }